

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fOcclusionQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::OcclusionQueryCase::iterate(OcclusionQueryCase *this)

{
  bool bVar1;
  deUint32 dVar2;
  GLint location;
  int iVar3;
  GLenum GVar4;
  int height_00;
  TestLog *this_00;
  RenderTarget *this_01;
  MessageBuilder *pMVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  TestError *this_02;
  RenderContext *context;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  MessageBuilder local_14c8;
  undefined4 local_1344;
  MessageBuilder local_1340;
  allocator<char> local_11b9;
  string local_11b8;
  allocator<char> local_1191;
  string local_1190;
  LogImage local_1170;
  bool local_10d9;
  char *pcStack_10d8;
  bool testOk;
  char *local_10d0;
  MessageBuilder local_10c8;
  RGBA local_f44;
  int local_f40;
  int local_f3c;
  int x;
  int y;
  int height;
  int width;
  undefined1 local_f08 [8];
  Surface pixels;
  deUint32 result;
  deUint32 resultAvailable;
  undefined8 uStack_ee0;
  int local_ed4;
  undefined1 local_ed0 [4];
  int i_1;
  int local_d50;
  int local_d4c;
  int scissorBoxH_2;
  int scissorBoxW_2;
  int scissorBoxY_2;
  int scissorBoxX_2;
  int local_bbc;
  MessageBuilder local_bb8;
  int local_a38;
  int local_a34;
  int scissorBoxH_1;
  int scissorBoxW_1;
  int scissorBoxY_1;
  int scissorBoxX_1;
  undefined8 uStack_a20;
  int local_a14;
  MessageBuilder local_a10;
  MessageBuilder local_890;
  int local_70c;
  MessageBuilder local_708;
  int local_588;
  int local_584;
  int scissorBoxH;
  int scissorBoxW;
  int scissorBoxY;
  int scissorBoxX;
  undefined8 uStack_570;
  int local_55c;
  MessageBuilder local_558;
  value_type local_3d4;
  int local_3d0;
  OccluderType type;
  int i;
  value_type local_3c4 [2];
  allocator<deqp::gles3::Functional::OccluderType> local_3b9;
  undefined1 local_3b8 [8];
  vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
  occOptions;
  int local_21c;
  MessageBuilder local_218;
  int local_98;
  int local_94;
  int targetH;
  int targetW;
  bool colorReadResult;
  bool queryResult;
  allocator<unsigned_int> local_7d;
  value_type_conflict4 local_7c;
  undefined1 local_78 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> queryIds;
  vector<float,_std::allocator<float>_> targetVertices;
  vector<float,_std::allocator<float>_> occluderVertices;
  deUint32 colorUnif;
  RenderTarget *renderTarget;
  TestLog *log;
  OcclusionQueryCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  this_01 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  dVar2 = glu::ShaderProgram::getProgram(this->m_program);
  location = glwGetUniformLocation(dVar2,"u_color");
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_7c = 0;
  std::allocator<unsigned_int>::allocator(&local_7d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,1,&local_7c,&local_7d);
  std::allocator<unsigned_int>::~allocator(&local_7d);
  targetH._3_1_ = 0;
  targetH._2_1_ = 0;
  local_94 = tcu::RenderTarget::getWidth(this_01);
  local_98 = tcu::RenderTarget::getHeight(this_01);
  tcu::TestLog::operator<<(&local_218,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_218,(char (*) [16])"Case iteration ");
  local_21c = this->m_iterNdx + 1;
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_21c);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2b9720c);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&NUM_CASE_ITERATIONS);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_218);
  tcu::TestLog::operator<<
            ((MessageBuilder *)
             &occOptions.
              super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,this_00,
             (BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)
                      &occOptions.
                       super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (char (*) [13])"Parameters:\n");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2c6096d);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_numOccluderDraws);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [18])" occluder draws, ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_numOccludersPerDraw);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [29])" primitive writes per draw,\n");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2c6096d);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_numTargetDraws);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [16])" target draws, ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_numTargetsPerDraw);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [19])" targets per draw\n");
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder
            ((MessageBuilder *)
             &occOptions.
              super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  glwClearColor(0.0,0.0,0.0,1.0);
  glwClearDepthf(1.0);
  glwClearStencil(0);
  glwClear(0x4500);
  dVar2 = glu::ShaderProgram::getProgram(this->m_program);
  glwUseProgram(dVar2);
  glwEnableVertexAttribArray(0);
  std::allocator<deqp::gles3::Functional::OccluderType>::allocator(&local_3b9);
  std::
  vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
  ::vector((vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
            *)local_3b8,0,&local_3b9);
  std::allocator<deqp::gles3::Functional::OccluderType>::~allocator(&local_3b9);
  if ((this->m_occluderTypes & 2) != 0) {
    local_3c4[1] = 2;
    std::
    vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
    ::push_back((vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                 *)local_3b8,local_3c4 + 1);
  }
  if ((this->m_occluderTypes & 4) != 0) {
    local_3c4[0] = OCCLUDER_DEPTH_CLEAR;
    std::
    vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
    ::push_back((vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                 *)local_3b8,local_3c4);
  }
  if ((this->m_occluderTypes & 8) != 0) {
    i = 8;
    std::
    vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
    ::push_back((vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                 *)local_3b8,(value_type *)&i);
  }
  if ((this->m_occluderTypes & 0x10) != 0) {
    type = OCCLUDER_STENCIL_CLEAR;
    std::
    vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
    ::push_back((vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                 *)local_3b8,&type);
  }
  local_3d0 = 0;
  while ((local_3d0 < this->m_numOccluderDraws &&
         (bVar1 = std::
                  vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                  ::empty((vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                           *)local_3b8), !bVar1))) {
    sVar6 = std::
            vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
            ::size((vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                    *)local_3b8);
    iVar3 = de::Random::getInt(&this->m_rnd,0,(int)sVar6 + -1);
    pvVar7 = std::
             vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
             ::operator[]((vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                           *)local_3b8,(long)iVar3);
    local_3d4 = *pvVar7;
    switch(local_3d4) {
    case OCCLUDER_DEPTH_WRITE:
      tcu::TestLog::operator<<(&local_558,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_558,(char (*) [15])"Occluder draw ");
      local_55c = local_3d0 + 1;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_55c);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2b9720c);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_numOccluderDraws);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2a18ff3);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])0x2b38390);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_558);
      scissorBoxY = (this->m_rnd).m_rnd.x;
      unique0x1000132e = (this->m_rnd).m_rnd.y;
      uStack_570._0_4_ = (this->m_rnd).m_rnd.z;
      uStack_570._4_4_ = (this->m_rnd).m_rnd.w;
      generateVertices((vector<float,_std::allocator<float>_> *)
                       &targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,2.0,2.0,
                       this->m_numOccludersPerDraw,3,(Random *)&scissorBoxY,this->m_occluderSize,0.0
                       ,0.6);
      de::Random::~Random((Random *)&scissorBoxY);
      glwEnable(0xb71);
      fVar10 = tcu::Vector<float,_4>::x((Vector<float,_4> *)DEPTH_WRITE_COLOR);
      fVar11 = tcu::Vector<float,_4>::y((Vector<float,_4> *)DEPTH_WRITE_COLOR);
      fVar12 = tcu::Vector<float,_4>::z((Vector<float,_4> *)DEPTH_WRITE_COLOR);
      fVar13 = tcu::Vector<float,_4>::w((Vector<float,_4> *)DEPTH_WRITE_COLOR);
      glwUniform4f(location,fVar10,fVar11,fVar12,fVar13);
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,0);
      glwVertexAttribPointer(0,4,0x1406,'\0',0,pvVar9);
      glwDrawArrays(4,0,this->m_numOccludersPerDraw * 3);
      glwDisable(0xb71);
      break;
    default:
      break;
    case OCCLUDER_DEPTH_CLEAR:
      scissorBoxW = de::Random::getInt(&this->m_rnd,-100,local_94);
      scissorBoxH = de::Random::getInt(&this->m_rnd,-100,local_98);
      local_584 = de::Random::getInt(&this->m_rnd,100,local_94 + 100);
      local_588 = de::Random::getInt(&this->m_rnd,100,local_98 + 100);
      tcu::TestLog::operator<<(&local_708,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_708,(char (*) [15])"Occluder draw ");
      local_70c = local_3d0 + 1;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_70c);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2b9720c);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_numOccluderDraws);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2a18ff3);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])"Depth clear");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_708);
      tcu::TestLog::operator<<(&local_890,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_890,(char (*) [29])"Depth-clearing box drawn at ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b0b32f);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&scissorBoxW);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a4b1eb);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&scissorBoxH);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2a94734);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])0x2b82092);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_584);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])", height = ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_588);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b6cb9a);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_890);
      glwEnable(0xc11);
      glwScissor(scissorBoxW,scissorBoxH,local_584,local_588);
      glwClearDepthf(0.0);
      fVar10 = tcu::Vector<float,_4>::x((Vector<float,_4> *)DEPTH_CLEAR_COLOR);
      fVar11 = tcu::Vector<float,_4>::y((Vector<float,_4> *)DEPTH_CLEAR_COLOR);
      fVar12 = tcu::Vector<float,_4>::z((Vector<float,_4> *)DEPTH_CLEAR_COLOR);
      fVar13 = tcu::Vector<float,_4>::w((Vector<float,_4> *)DEPTH_CLEAR_COLOR);
      glwClearColor(fVar10,fVar11,fVar12,fVar13);
      glwClear(0x4100);
      glwDisable(0xc11);
      break;
    case OCCLUDER_STENCIL_WRITE:
      tcu::TestLog::operator<<(&local_a10,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_a10,(char (*) [15])"Occluder draw ");
      local_a14 = local_3d0 + 1;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_a14);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2b9720c);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_numOccluderDraws);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2a18ff3);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [14])"Stencil write");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_a10);
      scissorBoxY_1 = (this->m_rnd).m_rnd.x;
      unique0x1000134e = (this->m_rnd).m_rnd.y;
      uStack_a20._0_4_ = (this->m_rnd).m_rnd.z;
      uStack_a20._4_4_ = (this->m_rnd).m_rnd.w;
      generateVertices((vector<float,_std::allocator<float>_> *)
                       &targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,2.0,2.0,
                       this->m_numOccludersPerDraw,3,(Random *)&scissorBoxY_1,this->m_occluderSize,
                       0.0,0.6);
      de::Random::~Random((Random *)&scissorBoxY_1);
      glwStencilFunc(0x207,1,0xff);
      glwStencilOp(0x1e00,0x1e00,0x1e01);
      glwEnable(0xb90);
      fVar10 = tcu::Vector<float,_4>::x((Vector<float,_4> *)STENCIL_WRITE_COLOR);
      fVar11 = tcu::Vector<float,_4>::y((Vector<float,_4> *)STENCIL_WRITE_COLOR);
      fVar12 = tcu::Vector<float,_4>::z((Vector<float,_4> *)STENCIL_WRITE_COLOR);
      fVar13 = tcu::Vector<float,_4>::w((Vector<float,_4> *)STENCIL_WRITE_COLOR);
      glwUniform4f(location,fVar10,fVar11,fVar12,fVar13);
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,0);
      glwVertexAttribPointer(0,4,0x1406,'\0',0,pvVar9);
      glwDrawArrays(4,0,this->m_numOccludersPerDraw * 3);
      glwDisable(0xb90);
      break;
    case OCCLUDER_STENCIL_CLEAR:
      scissorBoxW_1 = de::Random::getInt(&this->m_rnd,-100,local_94);
      scissorBoxH_1 = de::Random::getInt(&this->m_rnd,-100,local_98);
      local_a34 = de::Random::getInt(&this->m_rnd,100,local_94 + 100);
      local_a38 = de::Random::getInt(&this->m_rnd,100,local_98 + 100);
      tcu::TestLog::operator<<(&local_bb8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_bb8,(char (*) [15])"Occluder draw ");
      local_bbc = local_3d0 + 1;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_bbc);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2b9720c);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_numOccluderDraws);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2a18ff3);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [14])"Stencil clear");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_bb8);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&scissorBoxY_2,this_00,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&scissorBoxY_2,
                          (char (*) [31])"Stencil-clearing box drawn at ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b0b32f);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&scissorBoxW_1);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a4b1eb);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&scissorBoxH_1);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2a94734);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])0x2b82092);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_a34);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])", height = ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_a38);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b6cb9a);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&scissorBoxY_2);
      glwEnable(0xc11);
      glwScissor(scissorBoxW_1,scissorBoxH_1,local_a34,local_a38);
      glwClearStencil(1);
      fVar10 = tcu::Vector<float,_4>::x((Vector<float,_4> *)STENCIL_CLEAR_COLOR);
      fVar11 = tcu::Vector<float,_4>::y((Vector<float,_4> *)STENCIL_CLEAR_COLOR);
      fVar12 = tcu::Vector<float,_4>::z((Vector<float,_4> *)STENCIL_CLEAR_COLOR);
      fVar13 = tcu::Vector<float,_4>::w((Vector<float,_4> *)STENCIL_CLEAR_COLOR);
      glwClearColor(fVar10,fVar11,fVar12,fVar13);
      glwClear(0x4400);
      glwDisable(0xc11);
    }
    local_3d0 = local_3d0 + 1;
  }
  if ((this->m_occluderTypes & 1) != 0) {
    scissorBoxW_2 = de::Random::getInt(&this->m_rnd,-100,local_94 + -100);
    scissorBoxH_2 = de::Random::getInt(&this->m_rnd,-100,local_98 + -100);
    local_d4c = de::Random::getInt(&this->m_rnd,0xfa,local_94 + 100);
    local_d50 = de::Random::getInt(&this->m_rnd,0xfa,local_98 + 100);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_ed0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_ed0,(char (*) [22])"Scissor box drawn at ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b0b32f);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&scissorBoxW_2);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a4b1eb);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&scissorBoxH_2);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2a94734);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])0x2b82092);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_d4c);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])", height = ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_d50);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b6cb9a);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_ed0);
    glwEnable(0xc11);
    glwScissor(scissorBoxW_2,scissorBoxH_2,local_d4c,local_d50);
  }
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,0);
  glwGenQueries(1,pvVar8);
  GVar4 = this->m_queryMode;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,0);
  glwBeginQuery(GVar4,*pvVar8);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"Occlusion query started",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fOcclusionQueryTests.cpp"
                  ,0x154);
  glwEnable(0xb71);
  glwEnable(0xb90);
  glwStencilFunc(0x202,0,0xff);
  for (local_ed4 = 0; local_ed4 < this->m_numTargetDraws; local_ed4 = local_ed4 + 1) {
    result = (this->m_rnd).m_rnd.x;
    unique0x1000136e = (this->m_rnd).m_rnd.y;
    uStack_ee0._0_4_ = (this->m_rnd).m_rnd.z;
    uStack_ee0._4_4_ = (this->m_rnd).m_rnd.w;
    generateVertices((vector<float,_std::allocator<float>_> *)
                     &queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,2.0,2.0,
                     this->m_numTargetsPerDraw,3,(Random *)&result,this->m_targetSize,0.4,1.0);
    de::Random::~Random((Random *)&result);
    bVar1 = std::vector<float,_std::allocator<float>_>::empty
                      ((vector<float,_std::allocator<float>_> *)
                       &queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) {
      fVar10 = tcu::Vector<float,_4>::x((Vector<float,_4> *)TARGET_COLOR);
      fVar11 = tcu::Vector<float,_4>::y((Vector<float,_4> *)TARGET_COLOR);
      fVar12 = tcu::Vector<float,_4>::z((Vector<float,_4> *)TARGET_COLOR);
      fVar13 = tcu::Vector<float,_4>::w((Vector<float,_4> *)TARGET_COLOR);
      glwUniform4f(location,fVar10,fVar11,fVar12,fVar13);
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      glwVertexAttribPointer(0,4,0x1406,'\0',0,pvVar9);
      glwDrawArrays(4,0,this->m_numTargetsPerDraw * 3);
    }
  }
  glwEndQuery(this->m_queryMode);
  glwFinish();
  glwDisable(0xc11);
  glwDisable(0xb90);
  glwDisable(0xb71);
  pixels.m_pixels.m_cap._4_4_ = 0;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,0);
  glwGetQueryObjectuiv(*pvVar8,0x8867,(GLuint *)((long)&pixels.m_pixels.m_cap + 4));
  if (pixels.m_pixels.m_cap._4_4_ == 0) {
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Occlusion query failed to return a result after glFinish()",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fOcclusionQueryTests.cpp"
               ,0x174);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pixels.m_pixels.m_cap._0_4_ = 0;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,0);
  glwGetQueryObjectuiv(*pvVar8,0x8866,(GLuint *)&pixels.m_pixels.m_cap);
  targetH._3_1_ = (int)pixels.m_pixels.m_cap != 0;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,0);
  glwDeleteQueries(1,pvVar8);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"Occlusion query finished",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fOcclusionQueryTests.cpp"
                  ,0x17f);
  iVar3 = tcu::RenderTarget::getWidth(this_01);
  height_00 = tcu::RenderTarget::getHeight(this_01);
  tcu::Surface::Surface((Surface *)local_f08,iVar3,height_00);
  context = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&height,(Surface *)local_f08);
  glu::readPixels(context,0,0,(PixelBufferAccess *)&height);
  y = tcu::Surface::getWidth((Surface *)local_f08);
  x = tcu::Surface::getHeight((Surface *)local_f08);
  for (local_f3c = 0; local_f3c < x; local_f3c = local_f3c + 1) {
    for (local_f40 = 0; local_f40 < y; local_f40 = local_f40 + 1) {
      local_f44 = tcu::Surface::getPixel((Surface *)local_f08,local_f40,local_f3c);
      iVar3 = tcu::RGBA::getRed(&local_f44);
      if (iVar3 != 0) {
        targetH._2_1_ = 1;
        break;
      }
    }
    if ((targetH._2_1_ & 1) != 0) break;
  }
  tcu::TestLog::operator<<(&local_10c8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (&local_10c8,(char (*) [33])"Occlusion query result:  Target ");
  local_10d0 = "invisible";
  if ((targetH._3_1_ & 1) != 0) {
    local_10d0 = "visible";
  }
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_10d0);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b9e07b);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [33])"Framebuffer read result: Target ")
  ;
  pcStack_10d8 = "invisible";
  if ((targetH._2_1_ & 1) != 0) {
    pcStack_10d8 = "visible";
  }
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&stack0xffffffffffffef28);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_10c8);
  if (this->m_queryMode == 0x8d6a) {
    if (((targetH._3_1_ & 1) == 0) && ((targetH._2_1_ & 1) == 0)) {
      local_10d9 = (targetH._3_1_ & 1) == (targetH._2_1_ & 1);
    }
    else {
      local_10d9 = (bool)(targetH._3_1_ & 1);
    }
  }
  else {
    local_10d9 = (targetH._3_1_ & 1) == (targetH._2_1_ & 1);
  }
  if (local_10d9 == false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1190,"Result image",&local_1191);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_11b8,"Result image",&local_11b9);
    tcu::LogImage::LogImage
              (&local_1170,&local_1190,&local_11b8,(Surface *)local_f08,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(this_00,&local_1170);
    tcu::LogImage::~LogImage(&local_1170);
    std::__cxx11::string::~string((string *)&local_11b8);
    std::allocator<char>::~allocator(&local_11b9);
    std::__cxx11::string::~string((string *)&local_1190);
    std::allocator<char>::~allocator(&local_1191);
    tcu::TestLog::operator<<(&local_1340,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_1340,(char (*) [13])"Case FAILED!");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1340);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
    this_local._4_4_ = STOP;
  }
  else {
    tcu::TestLog::operator<<(&local_14c8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_14c8,(char (*) [13])"Case passed!");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_14c8);
    iVar3 = this->m_iterNdx + 1;
    this->m_iterNdx = iVar3;
    this_local._4_4_ = (IterateResult)(iVar3 < 10);
  }
  local_1344 = 1;
  tcu::Surface::~Surface((Surface *)local_f08);
  std::
  vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
  ::~vector((vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
             *)local_3b8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &queryIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &targetVertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return this_local._4_4_;
}

Assistant:

OcclusionQueryCase::IterateResult OcclusionQueryCase::iterate (void)
{
	tcu::TestLog&				log					= m_testCtx.getLog();
	const tcu::RenderTarget&	renderTarget		= m_context.getRenderTarget();
	deUint32					colorUnif			= glGetUniformLocation(m_program->getProgram(), "u_color");

	std::vector<float>			occluderVertices;
	std::vector<float>			targetVertices;
	std::vector<deUint32>		queryIds(1, 0);
	bool						queryResult			= false;
	bool						colorReadResult		= false;
	int							targetW				= renderTarget.getWidth();
	int							targetH				= renderTarget.getHeight();

	log << tcu::TestLog::Message << "Case iteration " << m_iterNdx+1 << " / " << NUM_CASE_ITERATIONS << tcu::TestLog::EndMessage;
	log << tcu::TestLog::Message << "Parameters:\n"
								 << "- " << m_numOccluderDraws	<< " occluder draws, "	<< m_numOccludersPerDraw	<< " primitive writes per draw,\n"
								 << "- " << m_numTargetDraws	<< " target draws, "	<< m_numTargetsPerDraw		<< " targets per draw\n"
		<< tcu::TestLog::EndMessage;

	DE_ASSERT(m_program);

	glClearColor				(0.0f, 0.0f, 0.0f, 1.0f);
	glClearDepthf				(1.0f);
	glClearStencil				(0);
	glClear						(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	glUseProgram				(m_program->getProgram());
	glEnableVertexAttribArray	(0);

	// Draw occluders

	std::vector<OccluderType> occOptions(0);
	if (m_occluderTypes & OCCLUDER_DEPTH_WRITE)		occOptions.push_back(OCCLUDER_DEPTH_WRITE);
	if (m_occluderTypes & OCCLUDER_DEPTH_CLEAR)		occOptions.push_back(OCCLUDER_DEPTH_CLEAR);
	if (m_occluderTypes & OCCLUDER_STENCIL_WRITE)	occOptions.push_back(OCCLUDER_STENCIL_WRITE);
	if (m_occluderTypes & OCCLUDER_STENCIL_CLEAR)	occOptions.push_back(OCCLUDER_STENCIL_CLEAR);

	for (int i = 0; i < m_numOccluderDraws; i++)
	{
		if (occOptions.empty())
			break;

		OccluderType type = occOptions[m_rnd.getInt(0, (int)occOptions.size()-1)];	// Choosing a random occluder type from available options

		switch (type)
		{
			case OCCLUDER_DEPTH_WRITE:
				log << tcu::TestLog::Message	<< "Occluder draw "	<< i+1 << " / " << m_numOccluderDraws << " : "
												<< "Depth write"	<< tcu::TestLog::EndMessage;

				generateVertices(occluderVertices, 2.0f, 2.0f, m_numOccludersPerDraw, 3, m_rnd, m_occluderSize, 0.0f, 0.6f);	// Generate vertices for occluding primitives

				DE_ASSERT(!occluderVertices.empty());

				glEnable				(GL_DEPTH_TEST);
				glUniform4f				(colorUnif, DEPTH_WRITE_COLOR.x(), DEPTH_WRITE_COLOR.y(), DEPTH_WRITE_COLOR.z(), DEPTH_WRITE_COLOR.w());
				glVertexAttribPointer	(0, ELEMENTS_PER_VERTEX, GL_FLOAT, GL_FALSE, 0, &occluderVertices[0]);
				glDrawArrays			(GL_TRIANGLES, 0, 3*m_numOccludersPerDraw);
				glDisable				(GL_DEPTH_TEST);

				break;

			case OCCLUDER_DEPTH_CLEAR:
			{
				int scissorBoxX = m_rnd.getInt(-DEPTH_CLEAR_OFFSET,	targetW);
				int scissorBoxY = m_rnd.getInt(-DEPTH_CLEAR_OFFSET,	targetH);
				int scissorBoxW = m_rnd.getInt( DEPTH_CLEAR_OFFSET,	targetW+DEPTH_CLEAR_OFFSET);
				int scissorBoxH = m_rnd.getInt( DEPTH_CLEAR_OFFSET,	targetH+DEPTH_CLEAR_OFFSET);

				log << tcu::TestLog::Message	<< "Occluder draw "	<< i+1 << " / " << m_numOccluderDraws << " : "	<< "Depth clear"
					<< tcu::TestLog::EndMessage;
				log << tcu::TestLog::Message	<< "Depth-clearing box drawn at "
												<< "("			<< scissorBoxX << ", "			<< scissorBoxY << ")"
												<< ", width = "	<< scissorBoxW << ", height = " << scissorBoxH << "."
					<< tcu::TestLog::EndMessage;

				glEnable		(GL_SCISSOR_TEST);
				glScissor		(scissorBoxX, scissorBoxY, scissorBoxW, scissorBoxH);
				glClearDepthf	(0.0f);
				glClearColor	(DEPTH_CLEAR_COLOR.x(), DEPTH_CLEAR_COLOR.y(), DEPTH_CLEAR_COLOR.z(), DEPTH_CLEAR_COLOR.w());
				glClear			(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
				glDisable		(GL_SCISSOR_TEST);

				break;
			}

			case OCCLUDER_STENCIL_WRITE:
				log << tcu::TestLog::Message	<< "Occluder draw "	<< i+1 << " / " << m_numOccluderDraws << " : "
												<< "Stencil write"	<< tcu::TestLog::EndMessage;

				generateVertices(occluderVertices, 2.0f, 2.0f, m_numOccludersPerDraw, 3, m_rnd, m_occluderSize, 0.0f, 0.6f);

				glStencilFunc	(GL_ALWAYS, 1, 0xFF);
				glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);

				DE_ASSERT(!occluderVertices.empty());

				glEnable				(GL_STENCIL_TEST);
				glUniform4f				(colorUnif, STENCIL_WRITE_COLOR.x(), STENCIL_WRITE_COLOR.y(), STENCIL_WRITE_COLOR.z(), STENCIL_WRITE_COLOR.w());
				glVertexAttribPointer	(0, ELEMENTS_PER_VERTEX, GL_FLOAT, GL_FALSE, 0, &occluderVertices[0]);
				glDrawArrays			(GL_TRIANGLES, 0, 3*m_numOccludersPerDraw);
				glDisable				(GL_STENCIL_TEST);

				break;

			case OCCLUDER_STENCIL_CLEAR:
			{
				int scissorBoxX = m_rnd.getInt(-STENCIL_CLEAR_OFFSET,	targetW);
				int scissorBoxY = m_rnd.getInt(-STENCIL_CLEAR_OFFSET,	targetH);
				int scissorBoxW = m_rnd.getInt(	STENCIL_CLEAR_OFFSET,	targetW+STENCIL_CLEAR_OFFSET);
				int scissorBoxH = m_rnd.getInt(	STENCIL_CLEAR_OFFSET,	targetH+STENCIL_CLEAR_OFFSET);

				log << tcu::TestLog::Message	<< "Occluder draw "	<< i+1 << " / " << m_numOccluderDraws << " : "	<< "Stencil clear"
					<< tcu::TestLog::EndMessage;
				log << tcu::TestLog::Message	<< "Stencil-clearing box drawn at "
												<< "("			<< scissorBoxX << ", "			<< scissorBoxY << ")"
												<< ", width = "	<< scissorBoxW << ", height = " << scissorBoxH << "."
					<< tcu::TestLog::EndMessage;

				glEnable		(GL_SCISSOR_TEST);
				glScissor		(scissorBoxX, scissorBoxY, scissorBoxW, scissorBoxH);
				glClearStencil	(1);
				glClearColor	(STENCIL_CLEAR_COLOR.x(), STENCIL_CLEAR_COLOR.y(), STENCIL_CLEAR_COLOR.z(), STENCIL_CLEAR_COLOR.w());
				glClear			(GL_COLOR_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
				glDisable		(GL_SCISSOR_TEST);

				break;
			}

			default:
				DE_ASSERT(false);
				break;
		}
	}

	if (m_occluderTypes & OCCLUDER_SCISSOR)
	{
		int scissorBoxX = m_rnd.getInt(-SCISSOR_OFFSET,	targetW-SCISSOR_OFFSET);
		int scissorBoxY = m_rnd.getInt(-SCISSOR_OFFSET,	targetH-SCISSOR_OFFSET);
		int scissorBoxW = m_rnd.getInt(SCISSOR_MINSIZE,	targetW+SCISSOR_OFFSET);
		int scissorBoxH = m_rnd.getInt(SCISSOR_MINSIZE,	targetH+SCISSOR_OFFSET);

		log << tcu::TestLog::Message	<< "Scissor box drawn at "
										<< "("			<< scissorBoxX << ", "			<< scissorBoxY << ")"
										<< ", width = "	<< scissorBoxW << ", height = " << scissorBoxH << "."
			<< tcu::TestLog::EndMessage;

		glEnable	(GL_SCISSOR_TEST);
		glScissor	(scissorBoxX, scissorBoxY, scissorBoxW, scissorBoxH);
	}

	glGenQueries	(1, &queryIds[0]);
	glBeginQuery	(m_queryMode, queryIds[0]);
	GLU_CHECK_MSG	("Occlusion query started");

	// Draw target primitives

	glEnable		(GL_DEPTH_TEST);
	glEnable		(GL_STENCIL_TEST);
	glStencilFunc	(GL_EQUAL, 0, 0xFF);

	for (int i = 0; i < m_numTargetDraws; i++)
	{
		generateVertices(targetVertices, 2.0f, 2.0f, m_numTargetsPerDraw, 3,  m_rnd, m_targetSize, 0.4f, 1.0f);		// Generate vertices for target primitives

		if (!targetVertices.empty())
		{
			glUniform4f				(colorUnif, TARGET_COLOR.x(), TARGET_COLOR.y(), TARGET_COLOR.z(), TARGET_COLOR.w());
			glVertexAttribPointer	(0, ELEMENTS_PER_VERTEX, GL_FLOAT, GL_FALSE, 0, &targetVertices[0]);
			glDrawArrays			(GL_TRIANGLES, 0, 3*m_numTargetsPerDraw);
		}
	}

	glEndQuery		(m_queryMode);
	glFinish		();
	glDisable		(GL_SCISSOR_TEST);
	glDisable		(GL_STENCIL_TEST);
	glDisable		(GL_DEPTH_TEST);

	// Check that query result is available.
	{
		deUint32 resultAvailable = GL_FALSE;
		glGetQueryObjectuiv(queryIds[0], GL_QUERY_RESULT_AVAILABLE, &resultAvailable);

		if (resultAvailable == GL_FALSE)
			TCU_FAIL("Occlusion query failed to return a result after glFinish()");
	}

	// Read query result.
	{
		deUint32 result = 0;
		glGetQueryObjectuiv(queryIds[0], GL_QUERY_RESULT, &result);
		queryResult = (result != GL_FALSE);
	}

	glDeleteQueries	(1, &queryIds[0]);
	GLU_CHECK_MSG	("Occlusion query finished");

	// Read pixel data

	tcu::Surface pixels(renderTarget.getWidth(), renderTarget.getHeight());
	glu::readPixels(m_context.getRenderContext(), 0, 0, pixels.getAccess());

	{
		int width = pixels.getWidth();
		int height = pixels.getHeight();

		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				if (pixels.getPixel(x,y).getRed() != 0)
				{
					colorReadResult = true;
					break;
				}
			}
			if (colorReadResult) break;
		}
	}

	log << tcu::TestLog::Message << "Occlusion query result:  Target " << (queryResult		? "visible" : "invisible") << "\n"
								 << "Framebuffer read result: Target " << (colorReadResult	? "visible" : "invisible") << tcu::TestLog::EndMessage;

	bool testOk = false;
	if (m_queryMode == GL_ANY_SAMPLES_PASSED_CONSERVATIVE)
	{
		if (queryResult || colorReadResult)
			testOk = queryResult;	// Allow conservative occlusion query to return false positives.
		else
			testOk = queryResult == colorReadResult;
	}
	else
		testOk = (queryResult == colorReadResult);

	if (!testOk)
	{
		log << tcu::TestLog::Image("Result image", "Result image", pixels);
		log << tcu::TestLog::Message << "Case FAILED!" << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	log << tcu::TestLog::Message << "Case passed!" << tcu::TestLog::EndMessage;

	return (++m_iterNdx < NUM_CASE_ITERATIONS) ? CONTINUE : STOP;
}